

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O2

bool __thiscall
CppJieba::MixSegment::cut_type
          (MixSegment *this,const_iterator begin,const_iterator end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  value_type_conflict *__x;
  bool bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  allocator local_d9;
  Unicode unico;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  hmmRes;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> infos;
  string local_78;
  string tmp;
  
  if ((this->super_SegmentBase)._isInited == false) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                  ,0xad,
                  "virtual bool CppJieba::MixSegment::cut_type(Unicode::const_iterator, Unicode::const_iterator, vector<string> &) const"
                 );
  }
  if (begin._M_current == end._M_current) {
    bVar1 = false;
  }
  else {
    infos.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    infos.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    infos.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = MPSegment::cut(&this->_mpSeg,begin,end,&infos);
    if (bVar1) {
      unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      hmmRes.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      hmmRes.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      hmmRes.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = '\0';
      for (uVar4 = 0; uVar5 = (ulong)uVar4,
          uVar5 < (ulong)(((long)infos.
                                 super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)infos.
                                super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x48);
          uVar4 = uVar4 + 1) {
        TransCode::encode(&infos.
                           super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar5].word,&tmp);
        __x = infos.
              super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar5].word.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
        if ((long)infos.
                  super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar5].word.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)__x == 2) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&unico,__x);
        }
        else {
          if (unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start !=
              unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::
            vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ::clear(&hmmRes);
            bVar1 = HMMSegment::cut(&this->_hmmSeg,
                                    (const_iterator)
                                    unico.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (const_iterator)
                                    unico.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,&hmmRes);
            if (!bVar1) {
              std::__cxx11::string::string((string *)&local_78,"_hmmSeg cut failed.",&local_d9);
              Limonp::Logger::LoggingF(3,"MixSegment.hpp",0xc9,&local_78);
              goto LAB_0011218a;
            }
            for (uVar6 = 0;
                (ulong)uVar6 <
                (ulong)(((long)hmmRes.
                               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)hmmRes.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar6 = uVar6 + 1)
            {
              TransCode::encode(hmmRes.
                                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar6,&tmp);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(res,&tmp);
            }
            if (unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start) {
              unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                   .super__Vector_impl_data._M_start;
            }
          }
          if (((infos.
                super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar5].tag._M_string_length == 0) ||
              (lVar3 = std::__cxx11::string::find
                                 ((char *)&infos.
                                           super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar5].tag,
                                  0x118b31), lVar3 != -1)) ||
             (lVar3 = std::__cxx11::string::find
                                ((char *)&infos.
                                          super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar5].tag,
                                 0x118b33), lVar3 != -1)) {
            TransCode::encode(&infos.
                               super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar5].word,&tmp);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(res,&tmp);
          }
        }
      }
      bVar1 = true;
      if (unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start !=
          unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
        ::clear(&hmmRes);
        bVar2 = HMMSegment::cut(&this->_hmmSeg,
                                (const_iterator)
                                unico.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (const_iterator)
                                unico.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_finish,&hmmRes);
        if (bVar2) {
          for (uVar4 = 0;
              (ulong)uVar4 <
              (ulong)(((long)hmmRes.
                             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)hmmRes.
                            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1) {
            TransCode::encode(hmmRes.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar4,&tmp);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(res,&tmp);
          }
        }
        else {
          std::__cxx11::string::string((string *)&local_78,"_hmmSeg cut failed.",&local_d9);
          Limonp::Logger::LoggingF(3,"MixSegment.hpp",0xe6,&local_78);
LAB_0011218a:
          std::__cxx11::string::~string((string *)&local_78);
          bVar1 = false;
        }
      }
      std::__cxx11::string::~string((string *)&tmp);
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::~vector(&hmmRes);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    }
    else {
      std::__cxx11::string::string((string *)&tmp,"mpSeg cutDAG failed.",(allocator *)&local_78);
      Limonp::Logger::LoggingF(3,"MixSegment.hpp",0xb5,&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      bVar1 = false;
    }
    std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::~vector(&infos);
  }
  return bVar1;
}

Assistant:

virtual bool cut_type(Unicode::const_iterator begin, Unicode::const_iterator end, vector<string>& res)const
            {
				assert(_getInitFlag());
                if(begin == end)
                {
                    return false;
                }
                vector<TrieNodeInfo> infos;
                if(!_mpSeg.cut(begin, end, infos))
                {
                    LogError("mpSeg cutDAG failed.");
                    return false;
                }
                Unicode unico;
                vector<Unicode> hmmRes;
                string tmp;
                for(uint i= 0; i < infos.size(); i++)
                {
                    TransCode::encode(infos[i].word,tmp);
                    if(1 == infos[i].word.size())
                    {
                        unico.push_back(infos[i].word[0]);
                    }
                    else
                    {
                        if(!unico.empty())
                        {
                            hmmRes.clear();
                            if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                            {
                                LogError("_hmmSeg cut failed.");
                                return false;
                            }
                            for(uint j = 0; j < hmmRes.size(); j++)
                            {
                                TransCode::encode(hmmRes[j], tmp);
                                res.push_back(tmp);
                            }
                        }
                        unico.clear();

						/* Ignore "Not n,v words" */
						//TransCode::encode(infos[i].word, tmp); //Just test
						//cout<<tmp<<infos[i].tag<<" / ";
						if( (infos[i].tag.empty())
								|| (string::npos != infos[i].tag.find("n"))
								|| (string::npos != infos[i].tag.find("v"))
							)
						{
							TransCode::encode(infos[i].word, tmp);
							res.push_back(tmp);
						}
                    }
                }
                if(!unico.empty())
                {
                    hmmRes.clear();
                    if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                    {
                        LogError("_hmmSeg cut failed.");
                        return false;
                    }
                    for(uint j = 0; j < hmmRes.size(); j++)
                    {
                        TransCode::encode(hmmRes[j], tmp);
                        res.push_back(tmp);
                    }
                }

                return true;
            }